

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O2

int put_string(char *dest,char *news,int where)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar2 = strlen(news);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)sVar2) {
    uVar4 = sVar2 & 0xffffffff;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    dest[uVar3 + (long)where] = news[uVar3];
  }
  iVar1 = (int)sVar2 + where;
  dest[iVar1] = '\0';
  return iVar1;
}

Assistant:

int
put_string(char *dest, const char *news, int where)
{
  int len = strlen(news);
  int i, cnt;
  for (i = where, cnt = 0; cnt < len; i++, cnt++)
    dest[i] = news[cnt];
  dest[where + len] = 0; //string terminator
  return where + len;    // index of the 0
}